

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_fd512ddf comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b;
  pdqsort_detail *this_00;
  double *pdVar1;
  double dVar2;
  double dVar3;
  HighsLpRelaxation *pHVar4;
  HighsLpRelaxation *pHVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  long lVar18;
  int *piVar19;
  undefined4 in_register_0000008c;
  HighsCutGeneration *pHVar20;
  long lVar21;
  long lVar22;
  HighsCutGeneration *pHVar23;
  _DistanceType __len;
  ulong uVar24;
  long lVar25;
  int *piVar26;
  bool bVar27;
  bool bVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  anon_class_16_2_fd512ddf comp_00;
  anon_class_16_2_fd512ddf comp_01;
  anon_class_16_2_fd512ddf comp_02;
  anon_class_16_2_fd512ddf comp_03;
  anon_class_16_2_fd512ddf comp_04;
  anon_class_16_2_fd512ddf comp_05;
  anon_class_16_2_fd512ddf comp_06;
  anon_class_16_2_fd512ddf comp_07;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:61:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:61:13)>
  __comp_00;
  T pivot;
  T tmp;
  uint local_6c;
  HighsInt *local_58;
  
  pHVar20 = (HighsCutGeneration *)CONCAT44(in_register_0000008c,bad_allowed);
  local_58 = comp.r;
  comp_00.this = comp.this;
  b._M_current = begin._M_current + -1;
  local_6c = bad_allowed;
LAB_002860db:
  lVar9 = (long)begin._M_current - (long)this;
  uVar11 = lVar9 >> 2;
  if (0x17 < (long)uVar11) {
    uVar24 = uVar11 >> 1;
    _Var10._M_current = (int *)((long)this + uVar24 * 4);
    if ((long)uVar11 < 0x81) {
      comp_07.r = (HighsInt *)pHVar20;
      comp_07.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)_Var10._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,b,end,
                 comp_07);
    }
    else {
      comp_03.r = (HighsInt *)pHVar20;
      comp_03.this = comp_00.this;
      _Var16._M_current = (int *)this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                (this,_Var10,b,end,comp_03);
      comp_04.r = (HighsInt *)pHVar20;
      comp_04.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)((long)this + 4),(int *)((long)this + (uVar24 - 1) * 4),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + -2),end,comp_04);
      piVar13 = (int *)((long)this + uVar24 * 4);
      comp_05.r = (HighsInt *)pHVar20;
      comp_05.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)((long)this + 8),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar13 + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + -3),end,comp_05);
      comp_06.r = (HighsInt *)pHVar20;
      comp_06.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)((long)this + (uVar24 - 1) * 4),_Var10,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar13 + 1),
                 end,comp_06);
      iVar6 = *(int *)this;
      *(int *)this = *piVar13;
      *piVar13 = iVar6;
      this = (pdqsort_detail *)_Var16._M_current;
    }
    if ((local_6c & 1) == 0) {
      lVar21 = (long)*(int *)((long)this + -4);
      iVar6 = *(int *)this;
      lVar18 = (long)iVar6;
      lVar12 = *(long *)(end._M_current + 0x14);
      dVar2 = *(double *)(lVar12 + lVar21 * 8);
      if ((1.5 <= dVar2) || (*(double *)(lVar12 + lVar18 * 8) <= 1.5)) {
        if ((dVar2 <= 1.5) ||
           (pdVar1 = (double *)(lVar12 + lVar18 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
          dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar21 * 8);
          dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar21 * 8) * dVar2;
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
          dVar31 = *(double *)(end._M_current + 0x2c);
          if (dVar30 + dVar31 < dVar29) goto LAB_002867e9;
          if (dVar30 - dVar31 <= dVar29) {
            if (ABS(dVar2 - dVar3) <= dVar31) {
              uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar21 * 4);
              lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
              lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
              uVar24 = (uVar24 + 0xc8497d2a400d9551) * lVar21 >> 0x20 ^
                       (uVar24 + 0x42d8680e260ae5b) * lVar25;
              uVar14 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
              pHVar20 = (HighsCutGeneration *)((uVar14 + 0x42d8680e260ae5b) * lVar25);
              uVar14 = (uVar14 + 0xc8497d2a400d9551) * lVar21 >> 0x20 ^ (ulong)pHVar20;
              bVar27 = uVar24 < uVar14;
              bVar28 = uVar24 == uVar14;
            }
            else {
              bVar28 = dVar2 == dVar3;
              bVar27 = dVar2 < dVar3;
            }
            if (!bVar27 && !bVar28) goto LAB_002867e9;
          }
        }
        dVar2 = *(double *)(lVar12 + lVar18 * 8);
        lVar9 = 0;
        do {
          lVar21 = (long)*(b._M_current + lVar9);
          if ((1.5 <= dVar2) || (*(double *)(lVar12 + lVar21 * 8) <= 1.5)) {
            if ((1.5 < dVar2) &&
               (pdVar1 = (double *)(lVar12 + lVar21 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
            goto LAB_0028725b;
            pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x30);
            pHVar4 = (&pHVar20->lpRelaxation)[lVar18];
            dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * (double)pHVar4;
            pHVar5 = (&pHVar20->lpRelaxation)[lVar21];
            dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar21 * 8) * (double)pHVar5;
            dVar3 = *(double *)(end._M_current + 0x2c);
            if (dVar31 <= dVar29 + dVar3) {
              if (dVar31 < dVar29 - dVar3) goto LAB_0028725b;
              if (ABS((double)pHVar4 - (double)pHVar5) <= dVar3) {
                uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
                lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
                lVar22 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
                uVar24 = (uVar11 + 0xc8497d2a400d9551) * lVar22 >> 0x20 ^
                         (uVar11 + 0x42d8680e260ae5b) * lVar25;
                uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar21 * 4);
                pHVar20 = (HighsCutGeneration *)((uVar11 + 0x42d8680e260ae5b) * lVar25);
                uVar11 = (uVar11 + 0xc8497d2a400d9551) * lVar22 >> 0x20 ^ (ulong)pHVar20;
                bVar27 = uVar24 < uVar11;
                bVar28 = uVar24 == uVar11;
              }
              else {
                bVar28 = (double)pHVar4 == (double)pHVar5;
                bVar27 = (double)pHVar4 < (double)pHVar5;
              }
              if (bVar27 || bVar28) goto LAB_0028725b;
            }
          }
          lVar9 = lVar9 + -4;
        } while( true );
      }
    }
LAB_002867e9:
    iVar6 = *(int *)this;
    lVar18 = (long)iVar6;
    lVar12 = *(long *)(end._M_current + 0x14);
    lVar21 = 0;
    _Var10._M_current = (int *)this;
    do {
      piVar13 = _Var10._M_current + 1;
      lVar25 = (long)*piVar13;
      dVar2 = *(double *)(lVar12 + lVar25 * 8);
      if ((1.5 <= dVar2) || (*(double *)(lVar12 + lVar18 * 8) <= 1.5)) {
        if ((1.5 < dVar2) &&
           (pdVar1 = (double *)(lVar12 + lVar18 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
        goto LAB_00286918;
        pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x1a);
        dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar25 * 8);
        dVar29 = (double)(&pHVar20->lpRelaxation)[lVar25] * dVar2;
        dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
        dVar30 = (double)(&pHVar20->lpRelaxation)[lVar18] * dVar3;
        dVar31 = *(double *)(end._M_current + 0x2c);
        if (dVar29 <= dVar30 + dVar31) {
          if (dVar29 < dVar30 - dVar31) goto LAB_00286918;
          if (ABS(dVar2 - dVar3) <= dVar31) {
            uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar25 * 4);
            lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
            lVar22 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
            pHVar23 = (HighsCutGeneration *)
                      ((uVar24 + 0xc8497d2a400d9551) * lVar22 >> 0x20 ^
                      (uVar24 + 0x42d8680e260ae5b) * lVar25);
            uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
            pHVar20 = (HighsCutGeneration *)
                      ((uVar24 + 0xc8497d2a400d9551) * lVar22 >> 0x20 ^
                      (uVar24 + 0x42d8680e260ae5b) * lVar25);
            bVar27 = pHVar23 < pHVar20;
            bVar28 = pHVar23 == pHVar20;
          }
          else {
            bVar28 = dVar2 == dVar3;
            bVar27 = dVar2 < dVar3;
          }
          if (bVar27 || bVar28) goto LAB_00286918;
        }
      }
      lVar21 = lVar21 + -4;
      _Var10._M_current = piVar13;
    } while( true );
  }
  if ((local_6c & 1) == 0) {
    if ((this == (pdqsort_detail *)begin._M_current) ||
       ((int *)((long)this + 4) == begin._M_current)) goto LAB_0028672d;
    lVar9 = *(long *)(end._M_current + 0x14);
    _Var10._M_current = (int *)this;
    piVar13 = (int *)((long)this + 4);
    do {
      iVar6 = _Var10._M_current[1];
      lVar18 = (long)*_Var10._M_current;
      lVar12 = (long)iVar6;
      dVar2 = *(double *)(lVar9 + lVar12 * 8);
      if ((1.5 <= dVar2) || (*(double *)(lVar9 + lVar18 * 8) <= 1.5)) {
        if ((dVar2 <= 1.5) ||
           (pdVar1 = (double *)(lVar9 + lVar18 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
          pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x1a);
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar12 * 8);
          dVar30 = (double)(&pHVar20->lpRelaxation)[lVar12] * dVar3;
          dVar31 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
          dVar32 = (double)(&pHVar20->lpRelaxation)[lVar18] * dVar31;
          dVar29 = *(double *)(end._M_current + 0x2c);
          if (dVar32 + dVar29 < dVar30) goto LAB_00286550;
          if (dVar32 - dVar29 <= dVar30) {
            if (ABS(dVar3 - dVar31) <= dVar29) {
              uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar12 * 4);
              lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
              lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
              pHVar20 = (HighsCutGeneration *)
                        ((uVar11 + 0xc8497d2a400d9551) * lVar21 >> 0x20 ^
                        (uVar11 + 0x42d8680e260ae5b) * lVar25);
              uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
              pHVar23 = (HighsCutGeneration *)
                        ((uVar11 + 0xc8497d2a400d9551) * lVar21 >> 0x20 ^
                        (uVar11 + 0x42d8680e260ae5b) * lVar25);
              bVar27 = pHVar20 < pHVar23;
              bVar28 = pHVar20 == pHVar23;
            }
            else {
              bVar28 = dVar3 == dVar31;
              bVar27 = dVar3 < dVar31;
            }
            if (!bVar27 && !bVar28) goto LAB_00286550;
          }
        }
      }
      else {
LAB_00286550:
        do {
          do {
            piVar19 = _Var10._M_current;
            _Var10._M_current = piVar19 + -1;
            piVar19[1] = *piVar19;
            pHVar20 = (HighsCutGeneration *)(long)piVar19[-1];
            if (dVar2 < 1.5) {
              if (1.5 < *(double *)(lVar9 + (long)pHVar20 * 8)) goto LAB_00286550;
            }
            if ((1.5 < dVar2) &&
               (pdVar1 = (double *)(lVar9 + (long)pHVar20 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
            goto LAB_00286661;
            dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar12 * 8);
            dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar12 * 8) * dVar3;
            dVar31 = *(double *)(*(long *)(end._M_current + 0x30) + (long)pHVar20 * 8);
            dVar32 = *(double *)(*(long *)(end._M_current + 0x1a) + (long)pHVar20 * 8) * dVar31;
            dVar29 = *(double *)(end._M_current + 0x2c);
          } while (dVar32 + dVar29 < dVar30);
          if (dVar30 < dVar32 - dVar29) break;
          if (ABS(dVar3 - dVar31) <= dVar29) {
            uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar12 * 4);
            lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
            lVar18 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
            pHVar23 = (HighsCutGeneration *)
                      ((uVar11 + 0xc8497d2a400d9551) * lVar18 >> 0x20 ^
                      (uVar11 + 0x42d8680e260ae5b) * lVar21);
            uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + (long)pHVar20 * 4);
            pHVar20 = (HighsCutGeneration *)
                      ((uVar11 + 0xc8497d2a400d9551) * lVar18 >> 0x20 ^
                      (uVar11 + 0x42d8680e260ae5b) * lVar21);
            bVar27 = pHVar23 < pHVar20;
            bVar28 = pHVar23 == pHVar20;
          }
          else {
            bVar28 = dVar3 == dVar31;
            bVar27 = dVar3 < dVar31;
          }
          pHVar20 = (HighsCutGeneration *)CONCAT71((int7)((ulong)pHVar20 >> 8),!bVar27 && !bVar28);
        } while (!bVar27 && !bVar28);
LAB_00286661:
        *piVar19 = iVar6;
      }
      piVar19 = piVar13 + 1;
      _Var10._M_current = piVar13;
      piVar13 = piVar19;
    } while (piVar19 != begin._M_current);
    goto LAB_00286a42;
  }
  if ((this != (pdqsort_detail *)begin._M_current) &&
     (piVar13 = (int *)((long)this + 4), piVar13 != begin._M_current)) {
    lVar9 = *(long *)(end._M_current + 0x14);
    lVar12 = 0;
    _Var10._M_current = (int *)this;
    do {
      iVar6 = *piVar13;
      pHVar20 = (HighsCutGeneration *)(long)*_Var10._M_current;
      lVar18 = (long)iVar6;
      dVar2 = *(double *)(lVar9 + lVar18 * 8);
      if ((1.5 <= dVar2) || (*(double *)(lVar9 + (long)pHVar20 * 8) <= 1.5)) {
        if ((dVar2 <= 1.5) ||
           (pdVar1 = (double *)(lVar9 + (long)pHVar20 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
          dVar31 = *(double *)(*(long *)(end._M_current + 0x30) + (long)pHVar20 * 8);
          dVar32 = *(double *)(*(long *)(end._M_current + 0x1a) + (long)pHVar20 * 8) * dVar31;
          dVar29 = *(double *)(end._M_current + 0x2c);
          if (dVar32 + dVar29 < dVar30) goto LAB_002861a2;
          if (dVar32 - dVar29 <= dVar30) {
            if (ABS(dVar3 - dVar31) <= dVar29) {
              uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
              lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
              lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
              pHVar23 = (HighsCutGeneration *)
                        ((uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                        (uVar11 + 0x42d8680e260ae5b) * lVar21);
              uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + (long)pHVar20 * 4);
              pHVar20 = (HighsCutGeneration *)
                        ((uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                        (uVar11 + 0x42d8680e260ae5b) * lVar21);
              bVar27 = pHVar23 < pHVar20;
              bVar28 = pHVar23 == pHVar20;
            }
            else {
              bVar28 = dVar3 == dVar31;
              bVar27 = dVar3 < dVar31;
            }
            pHVar20 = (HighsCutGeneration *)CONCAT71((int7)((ulong)pHVar20 >> 8),!bVar27 && !bVar28)
            ;
            if (!bVar27 && !bVar28) goto LAB_002861a2;
          }
        }
      }
      else {
LAB_002861a2:
        pHVar20 = (HighsCutGeneration *)(piVar13 + -1);
        *piVar13 = *_Var10._M_current;
        if (pHVar20 != (HighsCutGeneration *)this) {
          lVar21 = 0;
          do {
            iVar7 = *(_Var10._M_current + lVar21 + -4);
            lVar25 = (long)iVar7;
            if ((1.5 <= dVar2) || (*(double *)(lVar9 + lVar25 * 8) <= 1.5)) {
              if ((1.5 < dVar2) &&
                 (pdVar1 = (double *)(lVar9 + lVar25 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5)) break;
              dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
              dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
              dVar31 = *(double *)(*(long *)(end._M_current + 0x30) + lVar25 * 8);
              dVar32 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar25 * 8) * dVar31;
              dVar29 = *(double *)(end._M_current + 0x2c);
              if (dVar30 <= dVar32 + dVar29) {
                if (dVar30 < dVar32 - dVar29) goto LAB_00286326;
                if (ABS(dVar3 - dVar31) <= dVar29) {
                  uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
                  lVar22 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
                  lVar15 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
                  uVar24 = (uVar11 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
                           (uVar11 + 0x42d8680e260ae5b) * lVar22;
                  uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar25 * 4);
                  uVar11 = (uVar11 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
                           (uVar11 + 0x42d8680e260ae5b) * lVar22;
                  bVar27 = uVar24 < uVar11;
                  bVar28 = uVar24 == uVar11;
                }
                else {
                  bVar28 = dVar3 == dVar31;
                  bVar27 = dVar3 < dVar31;
                }
                if (bVar27 || bVar28) goto LAB_00286326;
              }
            }
            pHVar20 = (HighsCutGeneration *)
                      ((long)&pHVar20[-1].deltas.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
            *(_Var10._M_current + lVar21) = iVar7;
            lVar21 = lVar21 + -4;
          } while (lVar12 != lVar21);
          pHVar20 = (HighsCutGeneration *)(lVar21 + (long)_Var10._M_current);
        }
LAB_00286326:
        *(int *)&pHVar20->lpRelaxation = iVar6;
      }
      piVar13 = piVar13 + 1;
      _Var10._M_current = _Var10._M_current + 1;
      lVar12 = lVar12 + -4;
    } while (piVar13 != begin._M_current);
    goto LAB_00286a42;
  }
LAB_0028672d:
  bVar28 = true;
  goto LAB_00287727;
LAB_0028725b:
  piVar13 = b._M_current + lVar9;
  _Var10._M_current = (int *)this;
  if (lVar9 == 0) {
joined_r0x0028739b:
    if (_Var10._M_current < piVar13) {
      while( true ) {
        _Var10._M_current = _Var10._M_current + 1;
        lVar9 = (long)*_Var10._M_current;
        if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar12 + lVar9 * 8))) goto LAB_00287700;
        if ((1.5 < dVar2) &&
           (pdVar1 = (double *)(lVar12 + lVar9 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5)) break;
        pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x30);
        pHVar4 = (&pHVar20->lpRelaxation)[lVar18];
        dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * (double)pHVar4;
        pHVar5 = (&pHVar20->lpRelaxation)[lVar9];
        dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar9 * 8) * (double)pHVar5;
        dVar3 = *(double *)(end._M_current + 0x2c);
        if (dVar29 + dVar3 < dVar31) goto LAB_00287700;
        if (dVar31 < dVar29 - dVar3) break;
        if (ABS((double)pHVar4 - (double)pHVar5) <= dVar3) {
          uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
          lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
          lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
          uVar24 = (uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                   (uVar11 + 0x42d8680e260ae5b) * lVar21;
          uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar9 * 4);
          pHVar20 = (HighsCutGeneration *)((uVar11 + 0x42d8680e260ae5b) * lVar21);
          uVar11 = (uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^ (ulong)pHVar20;
          bVar27 = uVar24 < uVar11;
          bVar28 = uVar24 == uVar11;
        }
        else {
          bVar28 = (double)pHVar4 == (double)pHVar5;
          bVar27 = (double)pHVar4 < (double)pHVar5;
        }
        if ((piVar13 <= _Var10._M_current) || (!bVar27 && !bVar28)) goto LAB_00287700;
      }
      goto joined_r0x0028739b;
    }
  }
  else {
    do {
      do {
        do {
          _Var10._M_current = _Var10._M_current + 1;
          lVar9 = (long)*_Var10._M_current;
          if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar12 + lVar9 * 8))) goto LAB_00287700;
        } while ((1.5 < dVar2) &&
                (pdVar1 = (double *)(lVar12 + lVar9 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5));
        pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x30);
        pHVar4 = (&pHVar20->lpRelaxation)[lVar18];
        dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * (double)pHVar4;
        pHVar5 = (&pHVar20->lpRelaxation)[lVar9];
        dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar9 * 8) * (double)pHVar5;
        dVar3 = *(double *)(end._M_current + 0x2c);
        if (dVar29 + dVar3 < dVar31) goto LAB_00287700;
      } while (dVar31 < dVar29 - dVar3);
      if (ABS((double)pHVar4 - (double)pHVar5) <= dVar3) {
        uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
        lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
        lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar24 = (uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                 (uVar11 + 0x42d8680e260ae5b) * lVar21;
        uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar9 * 4);
        pHVar20 = (HighsCutGeneration *)((uVar11 + 0x42d8680e260ae5b) * lVar21);
        uVar11 = (uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^ (ulong)pHVar20;
        bVar27 = uVar24 < uVar11;
        bVar28 = uVar24 == uVar11;
      }
      else {
        bVar28 = (double)pHVar4 == (double)pHVar5;
        bVar27 = (double)pHVar4 < (double)pHVar5;
      }
    } while (bVar27 || bVar28);
  }
LAB_00287700:
  if (_Var10._M_current < piVar13) {
    iVar7 = *_Var10._M_current;
    *_Var10._M_current = *piVar13;
    *piVar13 = iVar7;
LAB_002874e1:
    do {
      do {
        piVar13 = piVar13 + -1;
        lVar9 = (long)*piVar13;
        if (dVar2 < 1.5) {
          if (1.5 < *(double *)(lVar12 + lVar9 * 8)) goto LAB_002874e1;
        }
        if ((1.5 < dVar2) &&
           (pdVar1 = (double *)(lVar12 + lVar9 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
        goto LAB_002875f1;
        pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x30);
        pHVar4 = (&pHVar20->lpRelaxation)[lVar18];
        dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * (double)pHVar4;
        pHVar5 = (&pHVar20->lpRelaxation)[lVar9];
        dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar9 * 8) * (double)pHVar5;
        dVar3 = *(double *)(end._M_current + 0x2c);
      } while (dVar29 + dVar3 < dVar31);
      if (dVar31 < dVar29 - dVar3) break;
      if (ABS((double)pHVar4 - (double)pHVar5) <= dVar3) {
        uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
        lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
        lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar24 = (uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                 (uVar11 + 0x42d8680e260ae5b) * lVar21;
        uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar9 * 4);
        pHVar20 = (HighsCutGeneration *)((uVar11 + 0x42d8680e260ae5b) * lVar21);
        uVar11 = (uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^ (ulong)pHVar20;
        bVar27 = uVar24 < uVar11;
        bVar28 = uVar24 == uVar11;
      }
      else {
        bVar28 = (double)pHVar4 == (double)pHVar5;
        bVar27 = (double)pHVar4 < (double)pHVar5;
      }
    } while (!bVar27 && !bVar28);
LAB_002875f1:
    do {
      do {
        do {
          _Var10._M_current = _Var10._M_current + 1;
          lVar9 = (long)*_Var10._M_current;
          if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar12 + lVar9 * 8))) goto LAB_00287700;
        } while ((1.5 < dVar2) &&
                (pdVar1 = (double *)(lVar12 + lVar9 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5));
        pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x30);
        pHVar4 = (&pHVar20->lpRelaxation)[lVar18];
        dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * (double)pHVar4;
        pHVar5 = (&pHVar20->lpRelaxation)[lVar9];
        dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar9 * 8) * (double)pHVar5;
        dVar3 = *(double *)(end._M_current + 0x2c);
        if (dVar29 + dVar3 < dVar31) goto LAB_00287700;
      } while (dVar31 < dVar29 - dVar3);
      if (ABS((double)pHVar4 - (double)pHVar5) <= dVar3) {
        uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
        lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
        lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar24 = (uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                 (uVar11 + 0x42d8680e260ae5b) * lVar21;
        uVar11 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar9 * 4);
        pHVar20 = (HighsCutGeneration *)((uVar11 + 0x42d8680e260ae5b) * lVar21);
        uVar11 = (uVar11 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^ (ulong)pHVar20;
        bVar27 = uVar24 < uVar11;
        bVar28 = uVar24 == uVar11;
      }
      else {
        bVar28 = (double)pHVar4 == (double)pHVar5;
        bVar27 = (double)pHVar4 < (double)pHVar5;
      }
    } while (bVar27 || bVar28);
    goto LAB_00287700;
  }
  *(int *)this = *piVar13;
  *piVar13 = iVar6;
  bVar28 = false;
  this = (pdqsort_detail *)(piVar13 + 1);
  goto LAB_00287727;
LAB_00286918:
  _Var16._M_current = b._M_current;
  if (lVar21 == 0) {
    _Var17._M_current = b._M_current;
    _Var16._M_current = begin._M_current;
    if (piVar13 < begin._M_current) {
      while( true ) {
        lVar21 = (long)*_Var17._M_current;
        dVar2 = *(double *)(lVar12 + lVar21 * 8);
        _Var16._M_current = _Var17._M_current;
        if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar12 + lVar18 * 8))) break;
        if ((dVar2 <= 1.5) ||
           (pdVar1 = (double *)(lVar12 + lVar18 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
          pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x1a);
          dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar21 * 8);
          dVar29 = (double)(&pHVar20->lpRelaxation)[lVar21] * dVar2;
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
          dVar30 = (double)(&pHVar20->lpRelaxation)[lVar18] * dVar3;
          dVar31 = *(double *)(end._M_current + 0x2c);
          if (dVar30 + dVar31 < dVar29) break;
          if (dVar29 < dVar30 - dVar31) goto LAB_00286adb;
          if (ABS(dVar2 - dVar3) <= dVar31) {
            uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar21 * 4);
            lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
            lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
            pHVar23 = (HighsCutGeneration *)
                      ((uVar24 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                      (uVar24 + 0x42d8680e260ae5b) * lVar21);
            uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
            pHVar20 = (HighsCutGeneration *)
                      ((uVar24 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                      (uVar24 + 0x42d8680e260ae5b) * lVar21);
            bVar27 = pHVar23 < pHVar20;
            bVar28 = pHVar23 == pHVar20;
          }
          else {
            bVar28 = dVar2 == dVar3;
            bVar27 = dVar2 < dVar3;
          }
          if ((_Var17._M_current <= piVar13) || (!bVar27 && !bVar28)) break;
        }
        else {
LAB_00286adb:
          if (_Var17._M_current <= piVar13) break;
        }
        _Var17._M_current = _Var17._M_current + -1;
      }
    }
  }
  else {
    while( true ) {
      lVar21 = (long)*_Var16._M_current;
      dVar2 = *(double *)(lVar12 + lVar21 * 8);
      if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar12 + lVar18 * 8))) break;
      if ((dVar2 <= 1.5) ||
         (pdVar1 = (double *)(lVar12 + lVar18 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
        pHVar20 = *(HighsCutGeneration **)(end._M_current + 0x1a);
        dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar21 * 8);
        dVar29 = (double)(&pHVar20->lpRelaxation)[lVar21] * dVar2;
        dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
        dVar30 = (double)(&pHVar20->lpRelaxation)[lVar18] * dVar3;
        dVar31 = *(double *)(end._M_current + 0x2c);
        if (dVar30 + dVar31 < dVar29) break;
        if (dVar30 - dVar31 <= dVar29) {
          if (ABS(dVar2 - dVar3) <= dVar31) {
            uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar21 * 4);
            lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
            lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
            pHVar23 = (HighsCutGeneration *)
                      ((uVar24 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                      (uVar24 + 0x42d8680e260ae5b) * lVar21);
            uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
            pHVar20 = (HighsCutGeneration *)
                      ((uVar24 + 0xc8497d2a400d9551) * lVar25 >> 0x20 ^
                      (uVar24 + 0x42d8680e260ae5b) * lVar21);
            bVar27 = pHVar23 < pHVar20;
            bVar28 = pHVar23 == pHVar20;
          }
          else {
            bVar28 = dVar2 == dVar3;
            bVar27 = dVar2 < dVar3;
          }
          if (!bVar27 && !bVar28) break;
        }
      }
      _Var16._M_current = _Var16._M_current + -1;
    }
  }
  piVar19 = _Var16._M_current;
  piVar26 = piVar13;
  if (piVar13 < _Var16._M_current) {
    do {
      iVar7 = *piVar26;
      *piVar26 = *piVar19;
      *piVar19 = iVar7;
LAB_00286ba4:
      do {
        do {
          _Var10._M_current = piVar26;
          piVar26 = _Var10._M_current + 1;
          lVar21 = (long)*piVar26;
          dVar2 = *(double *)(lVar12 + lVar21 * 8);
          if (dVar2 < 1.5) {
            if (1.5 < *(double *)(lVar12 + lVar18 * 8)) goto LAB_00286ba4;
          }
          if ((1.5 < dVar2) &&
             (pdVar1 = (double *)(lVar12 + lVar18 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
          goto LAB_00286caf;
          dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar21 * 8);
          dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar21 * 8) * dVar2;
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
          dVar31 = *(double *)(end._M_current + 0x2c);
        } while (dVar30 + dVar31 < dVar29);
        if (dVar29 < dVar30 - dVar31) break;
        if (ABS(dVar2 - dVar3) <= dVar31) {
          uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar21 * 4);
          lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
          lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
          uVar24 = (uVar24 + 0xc8497d2a400d9551) * lVar21 >> 0x20 ^
                   (uVar24 + 0x42d8680e260ae5b) * lVar25;
          uVar14 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
          uVar14 = (uVar14 + 0xc8497d2a400d9551) * lVar21 >> 0x20 ^
                   (uVar14 + 0x42d8680e260ae5b) * lVar25;
          bVar27 = uVar24 < uVar14;
          bVar28 = uVar24 == uVar14;
        }
        else {
          bVar28 = dVar2 == dVar3;
          bVar27 = dVar2 < dVar3;
        }
      } while (!bVar27 && !bVar28);
LAB_00286caf:
      do {
        do {
          do {
            piVar19 = piVar19 + -1;
            pHVar20 = (HighsCutGeneration *)(long)*piVar19;
            dVar2 = *(double *)(lVar12 + (long)pHVar20 * 8);
            if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar12 + lVar18 * 8))) goto LAB_00286dba;
          } while ((1.5 < dVar2) &&
                  (pdVar1 = (double *)(lVar12 + lVar18 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5));
          dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + (long)pHVar20 * 8);
          dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + (long)pHVar20 * 8) * dVar2;
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
          dVar31 = *(double *)(end._M_current + 0x2c);
          if (dVar30 + dVar31 < dVar29) goto LAB_00286dba;
        } while (dVar29 < dVar30 - dVar31);
        if (ABS(dVar2 - dVar3) <= dVar31) {
          uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + (long)pHVar20 * 4);
          lVar25 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
          lVar21 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
          pHVar20 = (HighsCutGeneration *)
                    ((uVar24 + 0xc8497d2a400d9551) * lVar21 >> 0x20 ^
                    (uVar24 + 0x42d8680e260ae5b) * lVar25);
          uVar24 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
          pHVar23 = (HighsCutGeneration *)
                    ((uVar24 + 0xc8497d2a400d9551) * lVar21 >> 0x20 ^
                    (uVar24 + 0x42d8680e260ae5b) * lVar25);
          bVar27 = pHVar20 < pHVar23;
          bVar28 = pHVar20 == pHVar23;
        }
        else {
          bVar28 = dVar2 == dVar3;
          bVar27 = dVar2 < dVar3;
        }
        pHVar20 = (HighsCutGeneration *)CONCAT71((int7)((ulong)pHVar20 >> 8),!bVar27 && !bVar28);
      } while (bVar27 || bVar28);
LAB_00286dba:
    } while (piVar26 < piVar19);
  }
  *(int *)this = *_Var10._M_current;
  *_Var10._M_current = iVar6;
  uVar14 = (long)_Var10._M_current - (long)this >> 2;
  this_00 = (pdqsort_detail *)(_Var10._M_current + 1);
  uVar24 = (long)begin._M_current - (long)this_00 >> 2;
  if (((long)uVar14 < (long)(uVar11 >> 3)) || ((long)uVar24 < (long)(uVar11 >> 3))) {
    uVar8 = (int)local_58 - 1;
    local_58 = (HighsInt *)(ulong)uVar8;
    if (uVar8 == 0) {
      lVar12 = (long)((uVar11 - ((long)(uVar11 - 2) >> 0x3f)) + -2) >> 1;
      _Var10._M_current = (int *)this;
      do {
        __comp._M_comp.r = (HighsInt *)comp_00.this;
        __comp._M_comp.this = (HighsCutGeneration *)end._M_current;
        pHVar20 = comp_00.this;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__1>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,lVar12,
                   uVar11,*(int *)((long)this + lVar12 * 4),__comp);
        bVar28 = lVar12 != 0;
        lVar12 = lVar12 + -1;
      } while (bVar28);
      bVar28 = true;
      _Var16._M_current = b._M_current;
      if (lVar9 < 5) {
        local_58 = (HighsInt *)0x0;
      }
      else {
        do {
          iVar6 = *_Var16._M_current;
          *_Var16._M_current = *(int *)this;
          lVar9 = lVar9 + -4;
          __comp_00._M_comp.r = (HighsInt *)comp_00.this;
          __comp_00._M_comp.this = (HighsCutGeneration *)end._M_current;
          pHVar20 = comp_00.this;
          this = (pdqsort_detail *)_Var10._M_current;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__1>>
                    (_Var10,0,lVar9 >> 2,iVar6,__comp_00);
          _Var16._M_current = _Var16._M_current + -1;
          _Var10._M_current = (int *)this;
        } while (4 < lVar9);
        local_58 = (HighsInt *)0x0;
LAB_00286a42:
        bVar28 = true;
      }
      goto LAB_00287727;
    }
    if (0x17 < (long)uVar14) {
      uVar11 = uVar14 & 0xfffffffffffffffc;
      iVar6 = *(int *)this;
      *(int *)this = *(int *)((long)this + uVar11);
      *(int *)((long)this + uVar11) = iVar6;
      iVar6 = _Var10._M_current[-1];
      _Var10._M_current[-1] = *(_Var10._M_current - uVar11);
      *(_Var10._M_current - uVar11) = iVar6;
      if (0x80 < (long)uVar14) {
        uVar14 = uVar14 >> 2;
        iVar6 = *(int *)((long)this + 4);
        *(int *)((long)this + 4) = *(int *)((long)this + (uVar14 + 1) * 4);
        *(int *)((long)this + (uVar14 + 1) * 4) = iVar6;
        iVar6 = *(int *)((long)this + 8);
        *(int *)((long)this + 8) = *(int *)((long)this + (uVar14 + 2) * 4);
        *(int *)((long)this + (uVar14 + 2) * 4) = iVar6;
        iVar6 = _Var10._M_current[-2];
        _Var10._M_current[-2] = _Var10._M_current[~uVar14];
        _Var10._M_current[~uVar14] = iVar6;
        iVar6 = _Var10._M_current[-3];
        _Var10._M_current[-3] = _Var10._M_current[-2 - uVar14];
        _Var10._M_current[-2 - uVar14] = iVar6;
      }
    }
    if (0x17 < (long)uVar24) {
      iVar6 = _Var10._M_current[1];
      uVar11 = uVar24 & 0xfffffffffffffffc;
      _Var10._M_current[1] = *(uVar11 + 4 + _Var10._M_current);
      *(uVar11 + 4 + _Var10._M_current) = iVar6;
      iVar6 = begin._M_current[-1];
      begin._M_current[-1] = *(begin._M_current - uVar11);
      *(begin._M_current - uVar11) = iVar6;
      if (0x80 < (long)uVar24) {
        uVar24 = uVar24 >> 2;
        iVar6 = _Var10._M_current[2];
        _Var10._M_current[2] = _Var10._M_current[uVar24 + 2];
        _Var10._M_current[uVar24 + 2] = iVar6;
        iVar6 = _Var10._M_current[3];
        _Var10._M_current[3] = _Var10._M_current[uVar24 + 3];
        _Var10._M_current[uVar24 + 3] = iVar6;
        iVar6 = begin._M_current[-2];
        begin._M_current[-2] = begin._M_current[~uVar24];
        begin._M_current[~uVar24] = iVar6;
        iVar6 = begin._M_current[-3];
        begin._M_current[-3] = begin._M_current[-2 - uVar24];
        begin._M_current[-2 - uVar24] = iVar6;
      }
    }
  }
  else if ((_Var16._M_current <= piVar13) &&
          (comp_00.r = begin._M_current, _Var16._M_current = begin._M_current,
          bVar28 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                             (this,_Var10,end,comp_00), bVar28)) {
    comp_01.r = _Var16._M_current;
    comp_01.this = comp_00.this;
    bVar27 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                       (this_00,begin,end,comp_01);
    bVar28 = true;
    if (bVar27) goto LAB_00287727;
  }
  pHVar20 = (HighsCutGeneration *)(ulong)(local_6c & 1);
  comp_02.r = local_58;
  comp_02.this = comp_00.this;
  pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
            (this,_Var10,end,comp_02,local_6c & 1,SUB81(this,0));
  bVar28 = false;
  local_6c = 0;
  this = this_00;
LAB_00287727:
  if (bVar28) {
    return;
  }
  goto LAB_002860db;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }